

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O2

int __thiscall
TPZSFMatrix<long_double>::Redim(TPZSFMatrix<long_double> *this,int64_t newDim,int64_t param_2)

{
  int iVar1;
  undefined4 extraout_var;
  uint extraout_var_00;
  longdouble *plVar2;
  undefined4 extraout_var_01;
  longdouble *plVar3;
  
  iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if (CONCAT44(extraout_var,iVar1) == newDim) {
    plVar2 = this->fElem;
  }
  else {
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = newDim;
    (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = newDim;
    if (this->fElem != (longdouble *)0x0) {
      operator_delete(this->fElem,0x10);
    }
    iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x4b])();
    plVar2 = (longdouble *)
             operator_new__(-(ulong)(extraout_var_00 >> 0x1c != 0) |
                            CONCAT44(extraout_var_00,iVar1) << 4);
    this->fElem = plVar2;
  }
  iVar1 = (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])(this);
  plVar3 = plVar2 + CONCAT44(extraout_var_01,iVar1);
  for (; plVar2 < plVar3; plVar2 = plVar2 + 1) {
    *plVar2 = (longdouble)0;
  }
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Redim( int64_t newDim , int64_t)
{
	// Se for preciso, desaloca a matriz antiga e aloca uma
	//  nova com o novo tamanho.
	if ( newDim != this->Dim() )
    {
		this->fRow = this->fCol = newDim;
		if ( fElem != NULL )
			delete( fElem );
		fElem = new TVar[Size()] ;
    }
	
	// Zera a matriz.
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ = 0.;
	this->fDecomposed = 0;
	this->fDefPositive = 0;
	
	
	return( 1 );
}